

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

int class_static_set(klass cls,char *key,value v)

{
  int iVar1;
  set_value pvVar2;
  long in_RDX;
  set_value in_RSI;
  undefined8 *in_RDI;
  attribute attr;
  accessor_type accessor;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  set in_stack_ffffffffffffffc8;
  undefined4 local_30 [2];
  set_value local_28;
  long local_20;
  set_value local_18;
  undefined8 *local_10;
  int local_4;
  
  if ((((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x18) == 0)) ||
     ((in_RSI == (set_value)0x0 || (in_RDX == 0)))) {
    local_4 = 1;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    pvVar2 = set_get(in_stack_ffffffffffffffc8,
                     (set_key)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (pvVar2 == (set_value)0x0) {
      if (*(int *)(local_10 + 1) == 0) {
        log_write_impl_va("metacall",0x221,"class_static_set",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                          ,LOG_LEVEL_ERROR,"Static attribute %s in class %s is not defined",local_18
                          ,*local_10);
        return 3;
      }
      if (*(int *)(local_10 + 1) == 1) {
        local_28 = local_18;
      }
      local_30[0] = 1;
    }
    else {
      local_30[0] = 0;
      local_28 = pvVar2;
    }
    iVar1 = (**(code **)(local_10[3] + 0x18))(local_10,local_10[2],local_30,local_20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      log_write_impl_va("metacall",0x234,"class_static_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Invalid class %s set of static attribute %s",*local_10,
                        local_18);
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

int class_static_set(klass cls, const char *key, value v)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_set != NULL && key != NULL && v != NULL)
	{
		struct accessor_type accessor;
		attribute attr = set_get(cls->static_attributes, (set_key)key);

		if (attr == NULL)
		{
			switch (cls->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Static attribute %s in class %s is not defined", key, cls->name);
					return 3;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		if (cls->interface->static_set(cls, cls->impl, &accessor, v) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s set of static attribute %s", cls->name, key);
			return 2;
		}

		return 0;
	}

	return 1;
}